

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool anon_unknown.dwarf_14f6153::IsValidFeatureFormat(string *format)

{
  long lVar1;
  undefined1 local_11;
  string *format_local;
  
  lVar1 = std::__cxx11::string::find((char *)format,0x1271c2c);
  local_11 = true;
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)format,0x1272763);
    local_11 = true;
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char *)format,0x127276e);
      local_11 = lVar1 != -1;
    }
  }
  return local_11;
}

Assistant:

bool IsValidFeatureFormat(const std::string& format)
{
  return format.find("<LIBRARY>") != std::string::npos ||
    format.find("<LIB_ITEM>") != std::string::npos ||
    format.find("<LINK_ITEM>") != std::string::npos;
}